

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_config5_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  target_ulong_conflict local_18;
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  env->CP0_Config5 =
       env->CP0_Config5 & (env->CP0_Config5_rw_bitmask ^ 0xffffffffU) |
       arg1 & env->CP0_Config5_rw_bitmask;
  if ((env->CP0_Config5 & 0x20000U) == 0) {
    local_18 = 0xff;
    if ((env->CP0_Config4 & 0x10000000U) != 0) {
      local_18 = 0x3ff;
    }
  }
  else {
    local_18 = 0;
  }
  env->CP0_EntryHi_ASID_mask = local_18;
  compute_hflags(env);
  return;
}

Assistant:

void helper_mtc0_config5(CPUMIPSState *env, target_ulong arg1)
{
    env->CP0_Config5 = (env->CP0_Config5 & (~env->CP0_Config5_rw_bitmask)) |
                       (arg1 & env->CP0_Config5_rw_bitmask);
    env->CP0_EntryHi_ASID_mask = (env->CP0_Config5 & (1 << CP0C5_MI)) ?
            0x0 : (env->CP0_Config4 & (1 << CP0C4_AE)) ? 0x3ff : 0xff;
    compute_hflags(env);
}